

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O0

TimerHandle TimerPool::Timer::Create(PoolHandle *pool,string *name)

{
  element_type *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TimerHandle TVar1;
  undefined1 local_40 [8];
  shared_ptr<(anonymous_namespace)::UserTimer> userHandle;
  shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_> timer;
  string *name_local;
  PoolHandle *pool_local;
  
  std::
  make_shared<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>,std::shared_ptr<TimerPool>const&,std::__cxx11::string_const&>
            ((shared_ptr<TimerPool> *)
             &userHandle.
              super___shared_ptr<(anonymous_namespace)::UserTimer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,name);
  std::
  make_shared<(anonymous_namespace)::UserTimer,std::shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>>const&>
            ((shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_> *)local_40);
  __p = &std::
         __shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>,_(__gnu_cxx::_Lock_policy)2>
         ::get((__shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>,_(__gnu_cxx::_Lock_policy)2>
                *)&userHandle.
                   super___shared_ptr<(anonymous_namespace)::UserTimer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount)->super_Timer;
  std::shared_ptr<TimerPool::Timer>::shared_ptr<(anonymous_namespace)::UserTimer>
            ((shared_ptr<TimerPool::Timer> *)pool,
             (shared_ptr<(anonymous_namespace)::UserTimer> *)local_40,__p);
  std::shared_ptr<(anonymous_namespace)::UserTimer>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::UserTimer> *)local_40);
  std::shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_> *)
             &userHandle.
              super___shared_ptr<(anonymous_namespace)::UserTimer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TVar1.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pool;
  return (TimerHandle)TVar1.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::Timer::TimerHandle TimerPool::Timer::Create(const PoolHandle& pool, const std::string& name)
{
    const auto timer      = std::make_shared<EnableConstructor<Timer>>(pool, name);
    const auto userHandle = std::make_shared<UserTimer>(timer);

    return std::shared_ptr<Timer>(userHandle, timer.get());
}